

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DoubleRange::SerializeWithCachedSizes
          (DoubleRange *this,CodedOutputStream *output)

{
  double dVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  DoubleRange *this_local;
  
  dVar1 = minvalue(this);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = minvalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(1,dVar1,output);
  }
  dVar1 = maxvalue(this);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = maxvalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(2,dVar1,output);
  }
  return;
}

Assistant:

void DoubleRange::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.DoubleRange)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double minValue = 1;
  if (this->minvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(1, this->minvalue(), output);
  }

  // double maxValue = 2;
  if (this->maxvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->maxvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.DoubleRange)
}